

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

size_t ggml_graph_nbytes(size_t size,_Bool grads)

{
  size_t sVar1;
  byte in_SIL;
  long in_RDI;
  size_t nbytes;
  void *p;
  size_t hash_size;
  void *local_20;
  size_t local_18;
  byte local_9;
  long local_8;
  
  local_9 = in_SIL & 1;
  local_8 = in_RDI;
  local_18 = ggml_hash_size(in_RDI << 1);
  local_20 = (void *)0x0;
  incr_ptr_aligned(&local_20,0x50,1);
  incr_ptr_aligned(&local_20,local_8 << 3,8);
  incr_ptr_aligned(&local_20,local_8 << 3,8);
  incr_ptr_aligned(&local_20,local_18 << 3,8);
  if ((local_9 & 1) != 0) {
    incr_ptr_aligned(&local_20,local_18 << 3,8);
    incr_ptr_aligned(&local_20,local_18 << 3,8);
  }
  sVar1 = ggml_bitset_size(local_18);
  incr_ptr_aligned(&local_20,sVar1 << 2,4);
  return (size_t)local_20;
}

Assistant:

static size_t ggml_graph_nbytes(size_t size, bool grads) {
    size_t hash_size = ggml_hash_size(size * 2);
    void * p = 0;
    incr_ptr_aligned(&p, sizeof(struct ggml_cgraph), 1);
    incr_ptr_aligned(&p, size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *)); // nodes
    incr_ptr_aligned(&p, size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *)); // leafs
    incr_ptr_aligned(&p, hash_size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *)); // hash keys
    if (grads) {
        incr_ptr_aligned(&p, hash_size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *)); // grads
        incr_ptr_aligned(&p, hash_size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *)); // grad_accs
    }
    incr_ptr_aligned(&p, ggml_bitset_size(hash_size) * sizeof(ggml_bitset_t), sizeof(ggml_bitset_t));

    size_t nbytes = (size_t) p;
    return nbytes;
}